

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool __thiscall
SingleNodeColumnSampler<long_double,_float>::initialize
          (SingleNodeColumnSampler<long_double,_float> *this,double *weights,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *col_indices,size_t curr_pos,
          size_t n_sample,bool backup_weights)

{
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  reference pvVar6;
  runtime_error *this_00;
  long in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  byte in_R9B;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar7;
  double __value;
  size_t col_3;
  size_t col_2;
  size_t col_1;
  size_t col;
  size_type sVar8;
  undefined2 in_stack_fffffffffffffef0;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffef2;
  double *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  size_type in_stack_ffffffffffffff08;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  size_t *in_stack_ffffffffffffff28;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff30;
  double *sample_weights;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  _Bit_reference in_stack_ffffffffffffff78;
  undefined1 __x;
  size_type in_stack_ffffffffffffff88;
  ulong uVar10;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  unsigned_long local_48;
  size_t local_40;
  byte local_31;
  ulong local_30;
  long local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  long local_18;
  bool local_1;
  
  __x = in_stack_ffffffffffffff78._M_mask._7_1_;
  local_31 = in_R9B & 1;
  if (in_RCX == 0) {
    local_1 = false;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4bc820);
    in_RDI[9] = (long)puVar4;
    in_RDI[10] = local_28;
    in_RDI[0xf] = in_RDI[10];
    *in_RDI = local_18;
    local_40 = log2ceil(in_RDI[10]);
    local_48 = 3;
    puVar4 = std::max<unsigned_long>(&local_40,&local_48);
    if (*puVar4 < local_30) {
      *(undefined1 *)(in_RDI + 0xb) = 1;
      *(undefined1 *)((long)in_RDI + 0x59) = 0;
      bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff00);
      if (bVar2) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      for (local_50 = 0; local_50 < (ulong)in_RDI[10]; local_50 = local_50 + 1) {
        in_stack_ffffffffffffff40 =
             *(vector<double,_std::allocator<double>_> **)(in_RDI[9] + local_50 * 8);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18)
                            ,local_50);
        *pvVar5 = (value_type)in_stack_ffffffffffffff40;
        vVar1 = *(value_type *)(local_18 + *(long *)(in_RDI[9] + local_50 * 8) * 8);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x15),local_50);
        *pvVar6 = vVar1;
        dVar7 = *(double *)(local_18 + *(long *)(in_RDI[9] + local_50 * 8) * 8);
        if ((dVar7 == 0.0) && (!NAN(dVar7))) {
          in_RDI[0xf] = in_RDI[0xf] + -1;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      sample_weights = (double *)(in_RDI + 0x10);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x4bcaca);
      build_btree_sampler<double>
                (in_stack_ffffffffffffff40,sample_weights,(size_t)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,(size_t *)in_stack_ffffffffffffff20);
      in_RDI[8] = 0;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),0);
      uVar3 = std::isinf(*pvVar6);
      if ((uVar3 & 1) != 0) {
        bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffff00);
        if (bVar2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (local_58 = 0; local_58 < (ulong)in_RDI[10]; local_58 = local_58 + 1) {
          uVar3 = std::isinf(*(double *)(local_18 + *(long *)(in_RDI[9] + local_58 * 8) * 8));
          if ((uVar3 & 1) == 0) {
            in_stack_ffffffffffffff20 =
                 *(vector<double,_std::allocator<double>_> **)(in_RDI[9] + local_58 * 8);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x18),local_58 - in_RDI[8]);
            *pvVar5 = (value_type)in_stack_ffffffffffffff20;
            in_stack_ffffffffffffff28 =
                 *(size_t **)(local_18 + *(long *)(in_RDI[9] + local_58 * 8) * 8);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x15),
                                local_58 - in_RDI[8]);
            *pvVar6 = (value_type)in_stack_ffffffffffffff28;
          }
          else {
            in_stack_ffffffffffffff30 =
                 *(vector<bool,_std::allocator<bool>_> **)(in_RDI[9] + local_58 * 8);
            sVar8 = in_RDI[8];
            in_RDI[8] = sVar8 + 1;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x1b),sVar8);
            *pvVar5 = (value_type)in_stack_ffffffffffffff30;
            *(undefined8 *)(local_18 + *(long *)(in_RDI[9] + local_58 * 8) * 8) = 0;
          }
        }
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x4bcd09);
        build_btree_sampler<double>
                  (in_stack_ffffffffffffff40,sample_weights,(size_t)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28,(size_t *)in_stack_ffffffffffffff20);
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),0);
      if ((*pvVar6 <= 0.0) && (in_RDI[8] == 0)) {
        return false;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0xb) = 0;
      *(byte *)((long)in_RDI + 0x59) = local_31 & 1;
      dVar7 = extraout_XMM0_Qa;
      if ((*(byte *)((long)in_RDI + 0x59) & 1) != 0) {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff00);
        if (bVar2) {
          in_stack_ffffffffffffff10 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0xc);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff08);
        }
        std::vector<double,std::allocator<double>>::assign<double*,void>
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   (double *)CONCAT62(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0));
        dVar7 = extraout_XMM0_Qa_00;
      }
      *(longdouble *)(in_RDI + 6) = (longdouble)0;
      for (local_60 = 0; local_60 < (ulong)in_RDI[10]; local_60 = local_60 + 1) {
        *(longdouble *)(in_RDI + 6) =
             *(longdouble *)(in_RDI + 6) +
             (longdouble)*(double *)(local_18 + *(long *)(in_RDI[9] + local_60 * 8) * 8);
        dVar7 = *(double *)(local_18 + *(long *)(in_RDI[9] + local_60 * 8) * 8);
        if ((dVar7 == 0.0) && (!NAN(dVar7))) {
          in_RDI[0xf] = in_RDI[0xf] + -1;
        }
      }
      uVar3 = std::isnan(dVar7);
      if ((uVar3 & 1) != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"NAs encountered. Try using a different value for \'missing_action\'.\n")
        ;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RDI[8] = 0;
      sVar8 = (size_type)*(unkbyte10 *)(in_RDI + 6);
      uVar9 = (undefined2)((unkuint10)*(unkbyte10 *)(in_RDI + 6) >> 0x40);
      uVar3 = std::isinf(__value);
      if ((uVar3 & 1) != 0) {
        bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_ffffffffffffff30);
        if (bVar2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,(bool)__x);
        }
        else {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          std::vector<bool,_std::allocator<bool>_>::assign
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT62(in_stack_fffffffffffffef2,uVar9),sVar8,(bool *)0x4bcff6);
        }
        *(longdouble *)(in_RDI + 6) = (longdouble)0;
        for (uVar10 = 0; uVar10 < (ulong)in_RDI[10]; uVar10 = uVar10 + 1) {
          uVar3 = std::isinf(*(double *)(local_18 + *(long *)(in_RDI[9] + uVar10 * 8) * 8));
          if ((uVar3 & 1) == 0) {
            *(longdouble *)(in_RDI + 6) =
                 *(longdouble *)(in_RDI + 6) +
                 (longdouble)*(double *)(local_18 + *(long *)(in_RDI[9] + uVar10 * 8) * 8);
          }
          else {
            in_RDI[8] = in_RDI[8] + 1;
            std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff78,true);
            *(undefined8 *)(local_18 + *(long *)(in_RDI[9] + uVar10 * 8) * 8) = 0;
          }
        }
      }
      if (((*(longdouble *)(in_RDI + 6) == (longdouble)0) &&
          (!NAN(*(longdouble *)(in_RDI + 6)) && !NAN((longdouble)0))) && (in_RDI[8] == 0)) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::initialize
(
    double *restrict weights,
    std::vector<size_t> *col_indices,
    size_t curr_pos,
    size_t n_sample,
    bool backup_weights
)
{
    if (!curr_pos) return false;

    this->col_indices = col_indices->data();
    this->curr_pos = curr_pos;
    this->n_left = this->curr_pos;
    this->weights_orig = weights;
    
    if (n_sample > std::max(log2ceil(this->curr_pos), (size_t)3))
    {
        this->using_tree = true;
        this->backup_weights = false;

        if (this->used_weights.empty()) {
            this->used_weights.reserve(col_indices->size());
            this->mapped_indices.reserve(col_indices->size());
            this->tree_weights.reserve(2 * col_indices->size());
        }

        this->used_weights.resize(this->curr_pos);
        this->mapped_indices.resize(this->curr_pos);

        for (size_t col = 0; col < this->curr_pos; col++) {
            this->mapped_indices[col] = this->col_indices[col];
            this->used_weights[col] = weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        this->tree_weights.resize(0);
        build_btree_sampler(this->tree_weights, this->used_weights.data(),
                            this->curr_pos, this->tree_levels, this->offset);

        this->n_inf = 0;
        if (std::isinf(this->tree_weights[0]))
        {
            if (this->mapped_inf_indices.empty())
                this->mapped_inf_indices.resize(this->curr_pos);

            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]]))
                {
                    this->mapped_inf_indices[this->n_inf++] = this->col_indices[col];
                    weights[this->col_indices[col]] = 0;
                }

                else
                {
                    this->mapped_indices[col - this->n_inf] = this->col_indices[col];
                    this->used_weights[col - this->n_inf] = weights[this->col_indices[col]];
                }
            }

            this->tree_weights.resize(0);
            build_btree_sampler(this->tree_weights, this->used_weights.data(),
                                this->curr_pos - this->n_inf, this->tree_levels, this->offset);
        }

        this->used_weights.resize(0);

        if (this->tree_weights[0] <= 0 && !this->n_inf)
            return false;
    }

    else
    {
        this->using_tree = false;
        this->backup_weights = backup_weights;

        if (this->backup_weights)
        {
            if (this->weights_own.empty())
                this->weights_own.resize(col_indices->size());
            this->weights_own.assign(weights, weights + this->curr_pos);
        }

        this->cumw = 0;
        for (size_t col = 0; col < this->curr_pos; col++) {
            this->cumw += weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        if (std::isnan(this->cumw))
            throw std::runtime_error("NAs encountered. Try using a different value for 'missing_action'.\n");

        /* if it's infinite, will choose among columns with infinite weight first */
        this->n_inf = 0;
        if (std::isinf(this->cumw))
        {
            if (this->inifinite_weights.empty())
                this->inifinite_weights.resize(col_indices->size());
            else
                this->inifinite_weights.assign(col_indices->size(), false);

            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]])) {
                    this->n_inf++;
                    this->inifinite_weights[this->col_indices[col]] = true;
                    weights[this->col_indices[col]] = 0;
                }

                else {
                    this->cumw += weights[this->col_indices[col]];
                }
            }
        }

        if (!this->cumw && !this->n_inf) return false;
    }

    return true;
}